

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInit.c
# Opt level: O0

int cuddZddInitUniv(DdManager *zdd)

{
  DdNode **ppDVar1;
  ulong uVar2;
  DdNode *pDVar3;
  int local_2c;
  uint index;
  int i;
  DdNode *res;
  DdNode *p;
  DdManager *zdd_local;
  
  ppDVar1 = (DdNode **)malloc((long)zdd->sizeZ << 3);
  zdd->univ = ppDVar1;
  if (zdd->univ == (DdNode **)0x0) {
    zdd->errorCode = CUDD_MEMORY_OUT;
    zdd_local._4_4_ = 0;
  }
  else {
    _index = zdd->one;
    uVar2 = (ulong)_index & 0xfffffffffffffffe;
    *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + 1;
    local_2c = zdd->sizeZ;
    while (local_2c = local_2c + -1, -1 < local_2c) {
      pDVar3 = cuddUniqueInterZdd(zdd,zdd->invpermZ[local_2c],_index,_index);
      if (pDVar3 == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(zdd,_index);
        if (zdd->univ != (DdNode **)0x0) {
          free(zdd->univ);
          zdd->univ = (DdNode **)0x0;
        }
        return 0;
      }
      *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
      *(int *)(((ulong)_index & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)_index & 0xfffffffffffffffe) + 4) + -1;
      zdd->univ[local_2c] = pDVar3;
      _index = pDVar3;
    }
    zdd_local._4_4_ = 1;
  }
  return zdd_local._4_4_;
}

Assistant:

int
cuddZddInitUniv(
  DdManager * zdd)
{
    DdNode      *p, *res;
    int         i;

    zdd->univ = ABC_ALLOC(DdNodePtr, zdd->sizeZ);
    if (zdd->univ == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }

    res = DD_ONE(zdd);
    cuddRef(res);
    for (i = zdd->sizeZ - 1; i >= 0; i--) {
        unsigned int index = zdd->invpermZ[i];
        p = res;
        res = cuddUniqueInterZdd(zdd, index, p, p);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(zdd,p);
            ABC_FREE(zdd->univ);
            return(0);
        }
        cuddRef(res);
        cuddDeref(p);
        zdd->univ[i] = res;
    }

#ifdef DD_VERBOSE
    cuddZddP(zdd, zdd->univ[0]);
#endif

    return(1);

}